

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

int cuddZddP(DdManager *zdd,DdNode *f)

{
  int iVar1;
  st__table *t;
  
  t = st__init_table(st__ptrcmp,st__ptrhash);
  if (t == (st__table *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = zp2(zdd,f,t);
    st__free_table(t);
    fputc(10,(FILE *)zdd->out);
  }
  return iVar1;
}

Assistant:

int
cuddZddP(
  DdManager * zdd,
  DdNode * f)
{
    int retval;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash);

    if (table == NULL) return(0);

    retval = zp2(zdd, f, table);
    st__free_table(table);
    (void) fputc('\n', zdd->out);
    return(retval);

}